

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_sqrt(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  double in_RDI;
  sexp unaff_retaddr;
  sexp in_stack_00000008;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp rem;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_ffffffffffffff98;
  sexp in_stack_ffffffffffffffa0;
  double f;
  sexp psVar1;
  sexp psVar2;
  sexp local_48;
  undefined1 local_40 [16];
  undefined8 uVar3;
  undefined8 in_stack_fffffffffffffff8;
  
  uVar3 = &DAT_0000043e;
  memset(local_40,0,0x10);
  local_48 = (sexp)0x43e;
  memset(&stack0xffffffffffffffa8,0,0x10);
  if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xc)) {
    local_40._0_8_ = &stack0xffffffffffffffd0;
    local_40._8_8_ = *(undefined8 *)((long)in_RDI + 0x6080);
    *(undefined1 **)((long)in_RDI + 0x6080) = local_40;
    psVar1 = (sexp)&local_48;
    psVar2 = *(sexp *)((long)in_RDI + 0x6080);
    *(undefined1 **)((long)in_RDI + 0x6080) = &stack0xffffffffffffffa8;
    uVar3 = sexp_bignum_sqrt(in_stack_00000008,unaff_retaddr,
                             (sexp_conflict *)in_stack_fffffffffffffff8);
    local_48 = sexp_bignum_normalize(in_stack_ffffffffffffff98);
    if (local_48 != (sexp)&DAT_00000001) {
      f = in_RDI;
      if ((uVar3 & 1) != 1) {
        sexp_bignum_to_double(psVar2);
      }
      uVar3 = sexp_make_flonum(psVar1,f);
    }
    *(undefined8 *)((long)in_RDI + 0x6080) = local_40._8_8_;
  }
  else if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xd)) {
    local_40._0_8_ = &stack0xffffffffffffffd0;
    local_40._8_8_ = *(undefined8 *)((long)in_RDI + 0x6080);
    *(undefined1 **)((long)in_RDI + 0x6080) = local_40;
    psVar1 = (sexp)&local_48;
    psVar2 = *(sexp *)((long)in_RDI + 0x6080);
    *(undefined1 **)((long)in_RDI + 0x6080) = &stack0xffffffffffffffa8;
    uVar3 = sexp_sqrt((sexp)in_RSI,(sexp)in_RDX,in_RCX,(sexp)uVar3);
    local_48 = sexp_sqrt((sexp)in_RSI,(sexp)in_RDX,in_RCX,(sexp)uVar3);
    if (((((uVar3 & 1) == 1) || (((uVar3 & 3) == 0 && (((sexp)uVar3)->tag == 0xc)))) ||
        (((uVar3 & 3) == 0 && (((sexp)uVar3)->tag == 0xd)))) &&
       (((((ulong)local_48 & 1) == 1 || ((((ulong)local_48 & 3) == 0 && (local_48->tag == 0xc)))) ||
        ((((ulong)local_48 & 3) == 0 && (local_48->tag == 0xd)))))) {
      uVar3 = sexp_make_ratio(psVar2,psVar1,in_stack_ffffffffffffffa0);
    }
    else {
      uVar3 = sexp_inexact_sqrt((sexp)in_RSI,(sexp)in_RDX,in_RCX,(sexp)uVar3);
    }
    *(undefined8 *)((long)in_RDI + 0x6080) = local_40._8_8_;
  }
  else {
    uVar3 = sexp_inexact_sqrt((sexp)in_RSI,(sexp)in_RDX,in_RCX,(sexp)uVar3);
  }
  return (sexp)uVar3;
}

Assistant:

sexp sexp_sqrt (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
#if SEXP_USE_BIGNUMS || SEXP_USE_RATIOS
  sexp_gc_var2(res, rem);
#endif
#if SEXP_USE_BIGNUMS
  if (sexp_bignump(z)) {
    sexp_gc_preserve2(ctx, res, rem);
    res = sexp_bignum_sqrt(ctx, z, &rem);
    rem = sexp_bignum_normalize(rem);
    if (rem != SEXP_ZERO)
      res = sexp_make_flonum(ctx, sexp_fixnump(res) ? sexp_unbox_fixnum(res) : sexp_bignum_to_double(res));
    sexp_gc_release2(ctx);
    return res;
  }
#endif
#if SEXP_USE_RATIOS
  if (sexp_ratiop(z)) {
    sexp_gc_preserve2(ctx, res, rem);
    res = sexp_sqrt(ctx, self, n, sexp_ratio_numerator(z));
    rem = sexp_sqrt(ctx, self, n, sexp_ratio_denominator(z));
    if (sexp_exactp(res) && sexp_exactp(rem)) {
      res = sexp_make_ratio(ctx, res, rem);
    } else {
      res = sexp_inexact_sqrt(ctx, self, n, z);
    }
    sexp_gc_release2(ctx);
    return res;
  }
#endif
  return sexp_inexact_sqrt(ctx, self, n, z);
}